

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgstrs.c
# Opt level: O0

void cgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  int local_2f0;
  float ci_1;
  float cr_1;
  float ci;
  float cr;
  char msg_1 [256];
  char msg [256];
  int local_d0;
  float local_cc;
  int ii;
  flops_t solve_ops;
  singlecomplex *soln;
  singlecomplex *rhs_work;
  singlecomplex *work;
  float local_a8;
  int nrhs;
  int ldb;
  int n;
  int jcol;
  int_t iptr;
  int_t istart;
  int_t luptr;
  int_t k;
  int_t j;
  int_t i;
  int irow;
  int nsupc;
  int nsupr;
  int nrow;
  int fsupc;
  singlecomplex *Uval;
  singlecomplex *Lval;
  NCformat *Ustore;
  SCformat *Lstore;
  singlecomplex *Bmat;
  DNformat *Bstore;
  singlecomplex temp_comp;
  SuperMatrix *B_local;
  int *perm_r_local;
  int *perm_c_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  trans_t trans_local;
  
  *info = 0;
  Bmat = (singlecomplex *)B->Store;
  local_a8 = Bmat->r;
  work._4_4_ = B->ncol;
  if (((trans == NOTRANS) || (trans == TRANS)) || (trans == CONJ)) {
    if (((L->nrow == L->ncol) && (-1 < L->nrow)) &&
       ((L->Stype == SLU_SC && ((L->Dtype == SLU_C && (L->Mtype == SLU_TRLU)))))) {
      if ((((U->nrow == U->ncol) && (-1 < U->nrow)) && (U->Stype == SLU_NC)) &&
         ((U->Dtype == SLU_C && (U->Mtype == SLU_TRU)))) {
        if (L->nrow < 0) {
          local_2f0 = 0;
        }
        else {
          local_2f0 = L->nrow;
        }
        if ((((int)local_a8 < local_2f0) || (B->Stype != SLU_DN)) ||
           ((B->Dtype != SLU_C || (B->Mtype != SLU_GE)))) {
          *info = -6;
        }
      }
      else {
        *info = -3;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  temp_comp = (singlecomplex)B;
  if (*info == 0) {
    nrhs = L->nrow;
    rhs_work = singlecomplexCalloc((long)nrhs * (long)work._4_4_);
    if (rhs_work == (singlecomplex *)0x0) {
      sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8d,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgstrs.c");
      superlu_abort_and_exit(msg_1 + 0xf8);
    }
    _ii = singlecomplexMalloc((long)nrhs);
    if (_ii == (singlecomplex *)0x0) {
      sprintf((char *)&ci,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8f,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgstrs.c");
      superlu_abort_and_exit((char *)&ci);
    }
    Lstore = *(SCformat **)(Bmat + 1);
    Ustore = (NCformat *)L->Store;
    Uval = (singlecomplex *)Ustore->nzval;
    Lval = (singlecomplex *)U->Store;
    _nrow = Lval[1];
    local_cc = 0.0;
    if (trans == NOTRANS) {
      for (k = 0; k < work._4_4_; k = k + 1) {
        soln = (singlecomplex *)((long)Lstore + (long)k * (long)(int)local_a8 * 8);
        for (istart = 0; istart < nrhs; istart = istart + 1) {
          _ii[perm_r[istart]] = soln[istart];
        }
        for (istart = 0; istart < nrhs; istart = istart + 1) {
          soln[istart] = _ii[istart];
        }
      }
      for (istart = 0; istart <= *(int *)&Ustore->field_0x4; istart = istart + 1) {
        nsupr = Ustore[1].rowind[istart];
        jcol = *(int *)(*(long *)(Ustore + 1) + (long)nsupr * 4);
        irow = *(int *)(*(long *)(Ustore + 1) + (long)(nsupr + 1) * 4) - jcol;
        i = Ustore[1].rowind[istart + 1] - nsupr;
        nsupc = irow - i;
        local_cc = (float)(nsupc * 8 * i * work._4_4_) +
                   (float)(i * 4 * (i + -1) * work._4_4_) + local_cc;
        if (i == 1) {
          for (luptr = 0; luptr < work._4_4_; luptr = luptr + 1) {
            soln = (singlecomplex *)(&Lstore->nnz + (long)luptr * (long)(int)local_a8 * 2);
            iptr = Ustore->rowind[nsupr];
            n = jcol;
            while (n = n + 1, n < *(int *)(*(long *)(Ustore + 1) + (long)(nsupr + 1) * 4)) {
              j = Ustore->colptr[n];
              iptr = iptr + 1;
              Bstore._0_4_ = soln[nsupr].r * Uval[iptr].r + -(soln[nsupr].i * Uval[iptr].i);
              Bstore._4_4_ = soln[nsupr].i * Uval[iptr].r + soln[nsupr].r * Uval[iptr].i;
              soln[j].r = soln[j].r - Bstore._0_4_;
              soln[j].i = soln[j].i - Bstore._4_4_;
            }
          }
        }
        else {
          iptr = Ustore->rowind[nsupr];
          for (luptr = 0; luptr < work._4_4_; luptr = luptr + 1) {
            soln = (singlecomplex *)(&Lstore->nnz + (long)luptr * (long)(int)local_a8 * 2);
            clsolve(irow,i,Uval + iptr,soln + nsupr);
            cmatvec(irow,nsupc,i,Uval + (iptr + i),soln + nsupr,rhs_work);
            n = jcol + i;
            for (k = 0; k < nsupc; k = k + 1) {
              j = Ustore->colptr[n];
              soln[j].r = soln[j].r - rhs_work[k].r;
              soln[j].i = soln[j].i - rhs_work[k].i;
              rhs_work[k].r = 0.0;
              rhs_work[k].i = 0.0;
              n = n + 1;
            }
          }
        }
      }
      for (istart = *(int_t *)&Ustore->field_0x4; -1 < istart; istart = istart + -1) {
        nsupr = Ustore[1].rowind[istart];
        jcol = *(int *)(*(long *)(Ustore + 1) + (long)nsupr * 4);
        irow = *(int *)(*(long *)(Ustore + 1) + (long)(nsupr + 1) * 4) - jcol;
        i = Ustore[1].rowind[istart + 1] - nsupr;
        iptr = Ustore->rowind[nsupr];
        local_cc = (float)(i * 4 * (i + 1) * work._4_4_) + local_cc;
        if (i == 1) {
          soln = (singlecomplex *)Lstore;
          for (luptr = 0; luptr < work._4_4_; luptr = luptr + 1) {
            c_div(soln + nsupr,soln + nsupr,Uval + iptr);
            soln = soln + (int)local_a8;
          }
        }
        else {
          for (luptr = 0; luptr < work._4_4_; luptr = luptr + 1) {
            cusolve(irow,i,Uval + iptr,
                    (singlecomplex *)
                    (&Lstore->nnz + ((long)nsupr + (long)luptr * (long)(int)local_a8) * 2));
          }
        }
        for (luptr = 0; luptr < work._4_4_; luptr = luptr + 1) {
          soln = (singlecomplex *)(&Lstore->nnz + (long)luptr * (long)(int)local_a8 * 2);
          for (ldb = nsupr; ldb < nsupr + i; ldb = ldb + 1) {
            local_cc = (float)((*(int *)((long)Lval[3] + (long)(ldb + 1) * 4) -
                               *(int *)((long)Lval[3] + (long)ldb * 4)) * 8) + local_cc;
            for (k = *(int_t *)((long)Lval[3] + (long)ldb * 4);
                k < *(int *)((long)Lval[3] + (long)(ldb + 1) * 4); k = k + 1) {
              j = *(int *)((long)Lval[2] + (long)k * 4);
              Bstore._0_4_ = soln[ldb].r * *(float *)((long)_nrow + (long)k * 8) +
                             -(soln[ldb].i * *(float *)((long)_nrow + 4 + (long)k * 8));
              Bstore._4_4_ = soln[ldb].i * *(float *)((long)_nrow + (long)k * 8) +
                             soln[ldb].r * *(float *)((long)_nrow + 4 + (long)k * 8);
              soln[j].r = soln[j].r - Bstore._0_4_;
              soln[j].i = soln[j].i - Bstore._4_4_;
            }
          }
        }
      }
      for (k = 0; k < work._4_4_; k = k + 1) {
        soln = (singlecomplex *)(&Lstore->nnz + (long)k * (long)(int)local_a8 * 2);
        for (istart = 0; istart < nrhs; istart = istart + 1) {
          _ii[istart] = soln[perm_c[istart]];
        }
        for (istart = 0; istart < nrhs; istart = istart + 1) {
          soln[istart] = _ii[istart];
        }
      }
      stat->ops[0x11] = local_cc;
    }
    else {
      for (k = 0; k < work._4_4_; k = k + 1) {
        soln = (singlecomplex *)((long)Lstore + (long)k * (long)(int)local_a8 * 8);
        for (istart = 0; istart < nrhs; istart = istart + 1) {
          _ii[perm_c[istart]] = soln[istart];
        }
        for (istart = 0; istart < nrhs; istart = istart + 1) {
          soln[istart] = _ii[istart];
        }
      }
      stat->ops[0x11] = 0.0;
      if (trans == TRANS) {
        for (istart = 0; istart < work._4_4_; istart = istart + 1) {
          sp_ctrsv("U","T","N",L,U,
                   (singlecomplex *)(&Lstore->nnz + (long)istart * (long)(int)local_a8 * 2),stat,
                   info);
          sp_ctrsv("L","T","U",L,U,
                   (singlecomplex *)(&Lstore->nnz + (long)istart * (long)(int)local_a8 * 2),stat,
                   info);
        }
      }
      else {
        for (istart = 0; istart < work._4_4_; istart = istart + 1) {
          sp_ctrsv("U","C","N",L,U,
                   (singlecomplex *)(&Lstore->nnz + (long)istart * (long)(int)local_a8 * 2),stat,
                   info);
          sp_ctrsv("L","C","U",L,U,
                   (singlecomplex *)(&Lstore->nnz + (long)istart * (long)(int)local_a8 * 2),stat,
                   info);
        }
      }
      for (k = 0; k < work._4_4_; k = k + 1) {
        soln = (singlecomplex *)(&Lstore->nnz + (long)k * (long)(int)local_a8 * 2);
        for (istart = 0; istart < nrhs; istart = istart + 1) {
          _ii[istart] = soln[perm_r[istart]];
        }
        for (istart = 0; istart < nrhs; istart = istart + 1) {
          soln[istart] = _ii[istart];
        }
      }
    }
    superlu_free(rhs_work);
    superlu_free(_ii);
  }
  else {
    local_d0 = -*info;
    input_error("cgstrs",&local_d0);
  }
  return;
}

Assistant:

void
cgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    singlecomplex   alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    singlecomplex   *work_col;
#endif
    singlecomplex   temp_comp;
    DNformat *Bstore;
    singlecomplex   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    singlecomplex   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void cprint_soln(int n, int nrhs, const singlecomplex *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_C || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("cgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = singlecomplexCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = singlecomplexMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += 4 * nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 8 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			cc_mult(&temp_comp, &rhs_work[fsupc], &Lval[luptr]);
			c_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		CTRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		CGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		ctrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		cgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			c_sub(&rhs_work[irow], &rhs_work[irow], &work_col[i]);
			work_col[i].r = 0.0;
	                work_col[i].i = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    clsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    cmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			c_sub(&rhs_work[irow], &rhs_work[irow], &work[i]);
			work[i].r = 0.;
	                work[i].i = 0.;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	cprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += 4 * nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    c_div(&rhs_work[fsupc], &rhs_work[fsupc], &Lval[luptr]);
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		CTRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		ctrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    cusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			cc_mult(&temp_comp, &rhs_work[jcol], &Uval[i]);
			c_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	cprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
        if (trans == TRANS) {
	    for (k = 0; k < nrhs; ++k) {
	        /* Multiply by inv(U'). */
	        sp_ctrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	        /* Multiply by inv(L'). */
	        sp_ctrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         } else { /* trans == CONJ */
            for (k = 0; k < nrhs; ++k) {                
                /* Multiply by conj(inv(U')). */
                sp_ctrsv("U", "C", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
                
                /* Multiply by conj(inv(L')). */
                sp_ctrsv("L", "C", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         }
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}